

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

void __thiscall QAbstractItemViewPrivate::scrollerStateChanged(QAbstractItemViewPrivate *this)

{
  bool bVar1;
  QAbstractItemView *this_00;
  State SVar2;
  QScroller *this_01;
  QItemSelectionModel *pQVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<QItemSelectionRange> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemView **)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  this_01 = QScroller::scroller(&((this->super_QAbstractScrollAreaPrivate).viewport)->super_QObject)
  ;
  if (this_01 != (QScroller *)0x0) {
    SVar2 = QScroller::state(this_01);
    if (SVar2 == Dragging) {
      pQVar3 = QAbstractItemView::selectionModel(this_00);
      if (pQVar3 != (QItemSelectionModel *)0x0) {
        pQVar3 = QAbstractItemView::selectionModel(this_00);
        (**(code **)(*(long *)pQVar3 + 0x70))(pQVar3,&this->oldSelection,3);
        bVar1 = this->autoScroll;
        this->autoScroll = false;
        pQVar3 = QAbstractItemView::selectionModel(this_00);
        (**(code **)(*(long *)pQVar3 + 0x60))(pQVar3,&this->oldCurrent,0);
        this->autoScroll = bVar1;
      }
    }
    else if (SVar2 == Pressed) {
      pQVar3 = QAbstractItemView::selectionModel(this_00);
      if (pQVar3 != (QItemSelectionModel *)0x0) {
        QAbstractItemView::selectionModel(this_00);
        QItemSelectionModel::selection();
        QArrayDataPointer<QItemSelectionRange>::operator=
                  ((QArrayDataPointer<QItemSelectionRange> *)&this->oldSelection,&local_48);
        QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_48);
        QAbstractItemView::selectionModel(this_00);
        QItemSelectionModel::currentIndex();
        (this->oldCurrent).m.ptr = (QAbstractItemModel *)local_48.size;
        *(Data **)&this->oldCurrent = local_48.d;
        (this->oldCurrent).i = (quintptr)local_48.ptr;
      }
      goto LAB_004e012e;
    }
    local_48.d = (Data *)0x0;
    local_48.ptr = (QItemSelectionRange *)0x0;
    local_48.size = 0;
    QArrayDataPointer<QItemSelectionRange>::operator=
              ((QArrayDataPointer<QItemSelectionRange> *)&this->oldSelection,&local_48);
    QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_48);
    (this->oldCurrent).r = -1;
    (this->oldCurrent).c = -1;
    (this->oldCurrent).i = 0;
    (this->oldCurrent).m.ptr = (QAbstractItemModel *)0x0;
  }
LAB_004e012e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemViewPrivate::scrollerStateChanged()
{
    Q_Q(QAbstractItemView);

    if (QScroller *scroller = QScroller::scroller(viewport)) {
        switch (scroller->state()) {
        case QScroller::Pressed:
            // store the current selection in case we start scrolling
            if (q->selectionModel()) {
                oldSelection = q->selectionModel()->selection();
                oldCurrent = q->selectionModel()->currentIndex();
            }
            break;

        case QScroller::Dragging:
            // restore the old selection if we really start scrolling
            if (q->selectionModel()) {
                q->selectionModel()->select(oldSelection, QItemSelectionModel::ClearAndSelect);
                // block autoScroll logic while we are already handling scrolling
                const bool wasAutoScroll = autoScroll;
                autoScroll = false;
                q->selectionModel()->setCurrentIndex(oldCurrent, QItemSelectionModel::NoUpdate);
                autoScroll = wasAutoScroll;
            }
            Q_FALLTHROUGH();

        default:
            oldSelection = QItemSelection();
            oldCurrent = QModelIndex();
            break;
        }
    }
}